

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O0

void __thiscall
tcmalloc::anon_unknown_0::ChunkedStorageWriter::~ChunkedStorageWriter(ChunkedStorageWriter *this)

{
  ChunkedStorageWriter *this_local;
  
  ~ChunkedStorageWriter(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~ChunkedStorageWriter() override {
    FinalRecycle();
  }